

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int rtreeDestroy(sqlite3_vtab *pVtab)

{
  Rtree *pRtree_00;
  long in_RDI;
  char **unaff_retaddr;
  char *zCreate;
  sqlite3_callback in_stack_00000010;
  int rc;
  Rtree *pRtree;
  int local_14;
  
  pRtree_00 = (Rtree *)sqlite3_mprintf("DROP TABLE \'%q\'.\'%q_node\';DROP TABLE \'%q\'.\'%q_rowid\';DROP TABLE \'%q\'.\'%q_parent\';"
                                       ,*(undefined8 *)(in_RDI + 0x30),
                                       *(undefined8 *)(in_RDI + 0x38),*(undefined8 *)(in_RDI + 0x30)
                                       ,*(undefined8 *)(in_RDI + 0x38),
                                       *(undefined8 *)(in_RDI + 0x30),*(undefined8 *)(in_RDI + 0x38)
                                      );
  if (pRtree_00 == (Rtree *)0x0) {
    local_14 = 7;
  }
  else {
    nodeBlobReset(pRtree_00);
    local_14 = sqlite3_exec((sqlite3 *)pVtab,(char *)pRtree,in_stack_00000010,zCreate,unaff_retaddr)
    ;
    sqlite3_free((void *)0x297914);
  }
  if (local_14 == 0) {
    rtreeRelease((Rtree *)0x297925);
  }
  return local_14;
}

Assistant:

static int rtreeDestroy(sqlite3_vtab *pVtab){
  Rtree *pRtree = (Rtree *)pVtab;
  int rc;
  char *zCreate = sqlite3_mprintf(
    "DROP TABLE '%q'.'%q_node';"
    "DROP TABLE '%q'.'%q_rowid';"
    "DROP TABLE '%q'.'%q_parent';",
    pRtree->zDb, pRtree->zName,
    pRtree->zDb, pRtree->zName,
    pRtree->zDb, pRtree->zName
  );
  if( !zCreate ){
    rc = SQLITE_NOMEM;
  }else{
    nodeBlobReset(pRtree);
    rc = sqlite3_exec(pRtree->db, zCreate, 0, 0, 0);
    sqlite3_free(zCreate);
  }
  if( rc==SQLITE_OK ){
    rtreeRelease(pRtree);
  }

  return rc;
}